

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall
spectest::JSONParser::ParseConstVector(JSONParser *this,ValueTypes *out_types,Values *out_values)

{
  pointer *ppVVar1;
  pointer pVVar2;
  iterator __position;
  iterator __position_00;
  undefined8 uVar3;
  bool bVar4;
  Result RVar5;
  Enum EVar6;
  TypedValue tv;
  TypedValue local_88;
  ExpectedValue local_68;
  
  pVVar2 = (out_values->
           super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((out_values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
      _M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    (out_values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
    _M_impl.super__Vector_impl_data._M_finish = pVVar2;
  }
  RVar5 = Expect(this,"[");
  EVar6 = Error;
  if (RVar5.enum_ != Error) {
    bVar4 = Match(this,"]");
    if (bVar4) {
LAB_00170626:
      EVar6 = Ok;
    }
    else {
      do {
        local_88.value._16_8_ = local_88.value._16_8_ & 0xffffffff00000000;
        local_88.value.field_0.i64_ = 0;
        local_88.value.field_0._8_8_ = 0;
        local_68.value.value.type.enum_ = Any;
        local_68.value.value.field_0.i64_ = 0;
        local_68.value.value.field_0._8_8_ = 0;
        RVar5 = ParseExpectedValue(this,&local_68,No);
        if (RVar5.enum_ == Error) break;
        local_88.value._16_8_ =
             CONCAT44(local_68.value.value._20_4_,local_68.value.value.type.enum_);
        local_88.value.field_0._8_8_ = local_68.value.value.field_0._8_8_;
        local_88.type.enum_ = local_68.value.type.enum_;
        local_88._4_4_ = local_68.value._4_4_;
        uVar3 = local_88._0_8_;
        local_88.value.field_0.i64_ = local_68.value.value.field_0.i64_;
        __position._M_current =
             (out_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (out_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_realloc_insert<wabt::Type_const&>
                    ((vector<wabt::Type,std::allocator<wabt::Type>> *)out_types,__position,
                     &local_88.type);
        }
        else {
          local_88.type.enum_ = local_68.value.type.enum_;
          (__position._M_current)->enum_ = local_88.type.enum_;
          (out_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
          local_88._0_8_ = uVar3;
        }
        __position_00._M_current =
             (out_values->
             super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (out_values->
            super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>::
          _M_realloc_insert<wabt::interp::Value_const&>
                    ((vector<wabt::interp::Value,std::allocator<wabt::interp::Value>> *)out_values,
                     __position_00,&local_88.value);
        }
        else {
          (__position_00._M_current)->type = (ValueType)local_88.value.type.enum_;
          *(undefined4 *)&(__position_00._M_current)->field_0x14 = local_88.value._20_4_;
          ((__position_00._M_current)->field_0).i64_ = local_88.value.field_0.i64_;
          *(undefined8 *)((long)&(__position_00._M_current)->field_0 + 8) =
               local_88.value.field_0._8_8_;
          ppVVar1 = &(out_values->
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppVVar1 = *ppVVar1 + 1;
        }
        bVar4 = Match(this,"]");
        if (bVar4) goto LAB_00170626;
        RVar5 = Expect(this,",");
      } while (RVar5.enum_ != Error);
      EVar6 = Error;
    }
  }
  return (Result)EVar6;
}

Assistant:

wabt::Result JSONParser::ParseConstVector(ValueTypes* out_types, Values* out_values) {
  out_values->clear();
  EXPECT("[");
  bool first = true;
  while (!Match("]")) {
    if (!first) {
      EXPECT(",");
    }
    TypedValue tv;
    CHECK_RESULT(ParseConst(&tv));
    out_types->push_back(tv.type);
    out_values->push_back(tv.value);
    first = false;
  }
  return wabt::Result::Ok;
}